

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          istream *a_istream)

{
  byte bVar1;
  SI_Error SVar2;
  undefined1 local_238 [8];
  char szBuf [512];
  string strData;
  istream *a_istream_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  std::__cxx11::string::string((string *)(szBuf + 0x1f8));
  do {
    std::istream::get((char *)a_istream,(long)local_238,'\0');
    std::__cxx11::string::append(szBuf + 0x1f8);
    bVar1 = std::ios::good();
  } while ((bVar1 & 1) != 0);
  SVar2 = LoadData(this,(string *)(szBuf + 0x1f8));
  std::__cxx11::string::~string((string *)(szBuf + 0x1f8));
  return SVar2;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadData(std::istream &a_istream) {
	std::string strData;
	char szBuf[512];
	do {
		a_istream.get(szBuf, sizeof(szBuf), '\0');
		strData.append(szBuf);
	} while (a_istream.good());
	return LoadData(strData);
}